

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O2

ctmbstr prvTidytidyLocalizedString(uint messageType,languageDefinition *definition,uint plural)

{
  uint uVar1;
  languageDefinition *plVar2;
  
  uVar1 = (*definition->whichPluralForm)(plural);
  do {
    plVar2 = definition;
    definition = (languageDefinition *)&plVar2->messages[0].value;
    if (*(ctmbstr *)definition == (ctmbstr)0x0) {
      return (ctmbstr)0x0;
    }
  } while ((plVar2->messages[0].key != messageType) || (plVar2->messages[0].pluralForm != uVar1));
  return *(ctmbstr *)definition;
}

Assistant:

ctmbstr TY_(tidyLocalizedString)( uint messageType, languageDefinition *definition, uint plural )
{
    int i;
    languageDictionary *dictionary = &definition->messages;
    uint pluralForm = definition->whichPluralForm(plural);
    
    for (i = 0; (*dictionary)[i].value; ++i)
    {
        if ( (*dictionary)[i].key == messageType && (*dictionary)[i].pluralForm == pluralForm )
        {
            return (*dictionary)[i].value;
        }
    }
    return NULL;
}